

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O2

FT_Error af_cjk_metrics_init(AF_CJKMetrics metrics,FT_Face face)

{
  ushort uVar1;
  ushort uVar2;
  AF_Blue_Stringset AVar3;
  uint uVar4;
  FT_GlyphSlot_conflict pFVar5;
  FT_Vector *pFVar6;
  bool bVar7;
  FT_Face pFVar8;
  FT_Error FVar9;
  AF_CJKMetrics buf_;
  FT_ULong FVar10;
  long lVar11;
  char cVar12;
  AF_CJKBlueRec *pAVar13;
  uint count;
  uint count_00;
  AF_Blue_StringRec *pAVar14;
  AF_CJKAxisRec *pAVar15;
  AF_StyleMetrics_conflict pAVar16;
  AF_StyleMetrics_conflict metrics_00;
  byte bVar17;
  FT_Pos *pFVar18;
  undefined7 uVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  FT_CharMap charmap;
  FT_Vector *pFVar25;
  uint local_3a4;
  FT_Face local_3a0;
  AF_CJKMetrics local_398;
  FT_Pos *local_390;
  FT_CharMap local_388;
  AF_CJKAxisRec *local_380;
  AF_CJKAxisRec *local_378;
  AF_Blue_StringRec *local_370;
  FT_Pos flats [51];
  FT_Pos fills [51];
  
  charmap = face->charmap;
  metrics->units_per_em = (uint)face->units_per_EM;
  FVar9 = FT_Select_Charmap(face,FT_ENCODING_UNICODE);
  if (FVar9 == 0) {
    local_3a0 = face;
    local_388 = charmap;
    af_cjk_metrics_init_widths(metrics,face);
    AVar3 = ((metrics->root).style_class)->blue_stringset;
    buf_ = (AF_CJKMetrics)hb_buffer_create();
    local_378 = metrics->axis;
    local_380 = metrics->axis + 1;
    pAVar14 = af_blue_stringsets + AVar3;
    local_398 = metrics;
    while ((ulong)pAVar14->string != 0x1429) {
      pAVar16 = (AF_StyleMetrics_conflict)(af_blue_strings + pAVar14->string);
      uVar1 = pAVar14->properties;
      count_00 = 0;
      bVar7 = true;
      count = 0;
      local_370 = pAVar14;
      while( true ) {
        cVar12 = *(char *)&pAVar16->style_class;
        metrics_00 = pAVar16;
        if (cVar12 == '\0') break;
        while (pAVar16 = (AF_StyleMetrics_conflict)((long)&metrics_00->style_class + 1),
              cVar12 == ' ') {
          metrics_00 = pAVar16;
          cVar12 = *(char *)&pAVar16->style_class;
        }
        if (cVar12 == '|') {
          bVar7 = false;
        }
        else {
          face = (FT_Face)local_398;
          pAVar16 = (AF_StyleMetrics_conflict)
                    af_shaper_get_cluster((char *)metrics_00,&local_398->root,buf_,&local_3a4);
          if ((local_3a4 < 2) &&
             (face = (FT_Face)buf_,
             FVar10 = af_shaper_get_elem(metrics_00,buf_,0,(FT_Long *)0x0,(FT_Long *)0x0),
             pFVar8 = local_3a0, FVar10 != 0)) {
            face = (FT_Face)(FVar10 & 0xffffffff);
            FVar9 = FT_Load_Glyph(local_3a0,(FT_UInt)FVar10,1);
            if ((FVar9 == 0) && (pFVar5 = pFVar8->glyph, 2 < (pFVar5->outline).n_points)) {
              pFVar6 = (pFVar5->outline).points;
              uVar2 = (pFVar5->outline).n_contours;
              face = (FT_Face)0x0;
              if ((short)uVar2 < 1) {
                uVar2 = 0;
              }
              local_390 = &pFVar6->y;
              lVar11 = 0;
              uVar20 = 0xffffffffffffffff;
              iVar22 = 0;
              for (; (AF_CJKMetrics)face != (AF_CJKMetrics)(ulong)uVar2;
                  face = (FT_Face)((long)&(((AF_CJKMetrics)face)->root).style_class + 1)) {
                iVar21 = (int)(pFVar5->outline).contours[(long)face];
                if (iVar22 < iVar21) {
                  uVar23 = (ulong)iVar22;
                  lVar24 = (long)iVar21;
                  if ((uVar1 & 2) == 0) {
                    if ((uVar1 & 1) == 0) {
                      pFVar18 = local_390 + uVar23 * 2;
                      for (; (long)uVar23 <= lVar24; uVar23 = uVar23 + 1) {
                        if (*pFVar18 < lVar11 || (int)uVar20 < 0) {
                          uVar20 = uVar23;
                          lVar11 = *pFVar18;
                        }
                        uVar20 = uVar20 & 0xffffffff;
                        pFVar18 = pFVar18 + 2;
                      }
                    }
                    else {
                      pFVar18 = local_390 + uVar23 * 2;
                      for (; (long)uVar23 <= lVar24; uVar23 = uVar23 + 1) {
                        if (lVar11 < *pFVar18 || (int)uVar20 < 0) {
                          uVar20 = uVar23;
                          lVar11 = *pFVar18;
                        }
                        uVar20 = uVar20 & 0xffffffff;
                        pFVar18 = pFVar18 + 2;
                      }
                    }
                  }
                  else {
                    pFVar25 = pFVar6 + uVar23;
                    if ((uVar1 & 1) == 0) {
                      for (; (long)uVar23 <= lVar24; uVar23 = uVar23 + 1) {
                        if (pFVar25->x < lVar11 || (int)uVar20 < 0) {
                          uVar20 = uVar23;
                          lVar11 = pFVar25->x;
                        }
                        uVar20 = uVar20 & 0xffffffff;
                        pFVar25 = pFVar25 + 1;
                      }
                    }
                    else {
                      for (; (long)uVar23 <= lVar24; uVar23 = uVar23 + 1) {
                        if (lVar11 < pFVar25->x || (int)uVar20 < 0) {
                          uVar20 = uVar23;
                          lVar11 = pFVar25->x;
                        }
                        uVar20 = uVar20 & 0xffffffff;
                        pFVar25 = pFVar25 + 1;
                      }
                    }
                  }
                }
                iVar22 = iVar21 + 1;
              }
              if (bVar7) {
                uVar20 = (ulong)count;
                count = count + 1;
                fills[uVar20] = lVar11;
              }
              else {
                uVar20 = (ulong)count_00;
                count_00 = count_00 + 1;
                flats[uVar20] = lVar11;
                bVar7 = false;
              }
            }
          }
        }
      }
      if (count_00 != 0 || count != 0) {
        pAVar15 = local_378;
        if ((uVar1 & 2) == 0) {
          pAVar15 = local_380;
        }
        af_sort_pos(count,fills);
        pFVar18 = flats;
        af_sort_pos(count_00,pFVar18);
        uVar4 = pAVar15->blue_count;
        pAVar13 = pAVar15->blues + uVar4;
        pAVar15->blue_count = uVar4 + 1;
        if (count_00 == 0) {
          lVar11 = fills[count >> 1];
LAB_00176954:
          pAVar15->blues[uVar4].shoot.org = lVar11;
          (pAVar13->ref).org = lVar11;
          lVar24 = lVar11;
        }
        else {
          if (count == 0) {
            lVar11 = flats[count_00 >> 1];
            goto LAB_00176954;
          }
          lVar24 = fills[count >> 1];
          (pAVar13->ref).org = lVar24;
          lVar11 = flats[count_00 >> 1];
          pAVar15->blues[uVar4].shoot.org = lVar11;
        }
        uVar19 = (undefined7)((ulong)pFVar18 >> 8);
        face = (FT_Face)CONCAT71(uVar19,lVar24 <= lVar11);
        if ((lVar11 != lVar24) &&
           (bVar17 = lVar24 <= lVar11 ^ (byte)uVar1, face = (FT_Face)CONCAT71(uVar19,bVar17),
           (bVar17 & 1) == 0)) {
          face = (FT_Face)0x2;
          lVar11 = (lVar11 + lVar24) / 2;
          pAVar15->blues[uVar4].shoot.org = lVar11;
          (pAVar13->ref).org = lVar11;
        }
        pAVar15->blues[uVar4].flags = (uint)uVar1 * 2 & 2;
      }
      pAVar14 = local_370 + 1;
    }
    hb_buffer_destroy(buf_);
    af_cjk_metrics_check_digits(local_398,face);
    face = local_3a0;
    charmap = local_388;
  }
  FT_Set_Charmap(face,charmap);
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_cjk_metrics_init( AF_CJKMetrics  metrics,
                       FT_Face        face )
  {
    FT_CharMap  oldmap = face->charmap;


    metrics->units_per_em = face->units_per_EM;

    if ( !FT_Select_Charmap( face, FT_ENCODING_UNICODE ) )
    {
      af_cjk_metrics_init_widths( metrics, face );
      af_cjk_metrics_init_blues( metrics, face );
      af_cjk_metrics_check_digits( metrics, face );
    }

    FT_Set_Charmap( face, oldmap );
    return FT_Err_Ok;
  }